

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxTryOnce(Gia_Man_t *pNew,Str_Ntk_t *pNtk,Str_Mux_t *pTree,Str_Mux_t *pRoot,int Edge,
                  Vec_Int_t *vDelay,int fVerbose)

{
  int iVar1;
  uint local_8f8;
  int RetValue;
  int nChecks;
  int ForkBest;
  int nLength;
  int k;
  int i;
  int DelayInit;
  int DelayBest;
  int Delay;
  Str_Mux_t pBackup [3];
  int pPath [500];
  Vec_Int_t *vDelay_local;
  int Edge_local;
  Str_Mux_t *pRoot_local;
  Str_Mux_t *pTree_local;
  Str_Ntk_t *pNtk_local;
  Gia_Man_t *pNew_local;
  
  k = Str_MuxDelayEdge_rec(pRoot,Edge);
  nChecks = 0;
  RetValue = -1;
  local_8f8 = 0;
  i = k;
  iVar1 = Str_MuxFindPathEdge_rec(pRoot,Edge,&pBackup[2].Edge[2].FanDel,&nChecks);
  if (iVar1 == 0) {
    pNew_local._4_4_ = 0;
  }
  else {
    if (fVerbose != 0) {
      printf("Trying node %d with path of length %d.\n",(ulong)(uint)pRoot->Id,(ulong)(uint)nChecks)
      ;
    }
    for (nLength = 0; nLength < nChecks; nLength = nLength + 1) {
      for (ForkBest = nLength + 2; ForkBest < nChecks; ForkBest = ForkBest + 1) {
        Str_MuxChangeOnce(pTree,&pBackup[2].Edge[2].FanDel,nLength,ForkBest,(Str_Mux_t *)&DelayBest,
                          (Gia_Man_t *)0x0,(Vec_Int_t *)0x0);
        DelayInit = Str_MuxDelayEdge_rec(pRoot,Edge);
        Str_MuxChangeUndo(pTree,&pBackup[2].Edge[2].FanDel,nLength,ForkBest,(Str_Mux_t *)&DelayBest)
        ;
        if ((DelayInit < i) || ((0 < RetValue && (i == DelayInit)))) {
          i = DelayInit;
          RetValue = nLength << 0x10 | ForkBest;
        }
        if (fVerbose != 0) {
          printf("%2d %2d -> %3d (%3d)\n",(ulong)(uint)nLength,(ulong)(uint)ForkBest,
                 (ulong)(uint)DelayInit);
        }
        local_8f8 = local_8f8 + 1;
      }
    }
    if (RetValue == -1) {
      if (fVerbose != 0) {
        printf("Did not find!\n");
      }
      pNew_local._4_4_ = 0;
    }
    else {
      Str_MuxChangeOnce(pTree,&pBackup[2].Edge[2].FanDel,RetValue >> 0x10,RetValue & 0xffff,
                        (Str_Mux_t *)0x0,pNew,vDelay);
      if (fVerbose != 0) {
        printf("Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n",(ulong)(uint)pRoot->Id,
               (ulong)(uint)(RetValue >> 0x10),(ulong)(RetValue & 0xffff),(ulong)local_8f8,
               (ulong)(uint)k,CONCAT44((int)((ulong)vDelay >> 0x20),i));
        printf("\n");
      }
      pNew_local._4_4_ = 1;
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Str_MuxTryOnce( Gia_Man_t * pNew, Str_Ntk_t * pNtk, Str_Mux_t * pTree, Str_Mux_t * pRoot, int Edge, Vec_Int_t * vDelay, int fVerbose )
{
    int pPath[500];
    Str_Mux_t pBackup[3];
    int Delay, DelayBest = Str_MuxDelayEdge_rec( pRoot, Edge ), DelayInit = DelayBest;
    int i, k, nLength = 0, ForkBest = -1, nChecks = 0;
    int RetValue = Str_MuxFindPathEdge_rec( pRoot, Edge, pPath, &nLength );
    if ( RetValue == 0 )
        return 0;
    if ( fVerbose )
        printf( "Trying node %d with path of length %d.\n", pRoot->Id, nLength );
    for ( i = 0; i < nLength; i++ )
    for ( k = i+2; k < nLength; k++ )
    {
        Str_MuxChangeOnce( pTree, pPath, i, k, pBackup, NULL, NULL );
        Delay = Str_MuxDelayEdge_rec( pRoot, Edge );
        Str_MuxChangeUndo( pTree, pPath, i, k, pBackup );
        if ( DelayBest > Delay || (ForkBest > 0 && DelayBest == Delay) )
            DelayBest = Delay, ForkBest = (i << 16) | k;
        if ( fVerbose )
            printf( "%2d %2d -> %3d (%3d)\n", i, k, Delay, DelayBest );
        nChecks++;
    }
    if ( ForkBest == -1 )
    {
        if ( fVerbose )
            printf( "Did not find!\n" );
        return 0;
    }
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    Str_MuxChangeOnce( pTree, pPath, ForkBest >> 16, ForkBest & 0xFFFF, NULL, pNew, vDelay );
//    Str_MuxDelayPrint_rec( pRoot, Edge ); printf( "\n" );
    if ( fVerbose )
        printf( "Node %6d (%3d %3d) : Checks = %d. Delay: %d -> %d.\n", 
            pRoot->Id, ForkBest >> 16, ForkBest & 0xFFFF, nChecks, DelayInit, DelayBest );
    if ( fVerbose )
        printf( "\n" );
    return 1;
}